

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::ImageFeatureType::SharedCtor(ImageFeatureType *this)

{
  this->colorspace_ = 0;
  this->width_ = 0;
  this->height_ = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void ImageFeatureType::SharedCtor() {
  ::memset(&width_, 0, reinterpret_cast<char*>(&colorspace_) -
    reinterpret_cast<char*>(&width_) + sizeof(colorspace_));
  clear_has_SizeFlexibility();
  _cached_size_ = 0;
}